

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

Type __thiscall wasm::WasmBinaryBuilder::getType(WasmBinaryBuilder *this,int initial)

{
  bool bVar1;
  HeapType heapType;
  Nullability nullable;
  Signature SVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Type local_30;
  Type type;
  
  if (initial < 0) {
    local_30.id = 0;
    bVar1 = getBasicType(this,initial,&local_30);
    if (bVar1) {
      type.id = local_30.id;
    }
    else {
      if (initial == -0x14) {
        heapType = getHeapType(this);
        nullable = Nullable;
      }
      else {
        if (initial != -0x15) {
          if (initial == -0x40) {
            return (Type)0;
          }
          std::__cxx11::to_string(&local_70,initial);
          std::operator+(&local_50,"invalid wasm type: ",&local_70);
          throwError(this,&local_50);
        }
        heapType = getHeapType(this);
        nullable = NonNullable;
      }
      wasm::Type::Type(&type,heapType,nullable);
    }
  }
  else {
    SVar2 = getSignatureByTypeIndex(this,initial);
    type = SVar2.results.id;
  }
  return (Type)type.id;
}

Assistant:

Type WasmBinaryBuilder::getType(int initial) {
  // Single value types are negative; signature indices are non-negative
  if (initial >= 0) {
    // TODO: Handle block input types properly.
    return getSignatureByTypeIndex(initial).results;
  }
  Type type;
  if (getBasicType(initial, type)) {
    return type;
  }
  switch (initial) {
    // None only used for block signatures. TODO: Separate out?
    case BinaryConsts::EncodedType::Empty:
      return Type::none;
    case BinaryConsts::EncodedType::nullable:
      return Type(getHeapType(), Nullable);
    case BinaryConsts::EncodedType::nonnullable:
      return Type(getHeapType(), NonNullable);
    default:
      throwError("invalid wasm type: " + std::to_string(initial));
  }
  WASM_UNREACHABLE("unexpected type");
}